

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O2

bool GetN(BLH blh,ELLIPSOID ellipsoid,double *N)

{
  double dVar1;
  
  dVar1 = sin((blh.B * 3600.0) / 206264.80624709636);
  dVar1 = 1.0 - ellipsoid.e2 * dVar1 * dVar1;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  if (1e-06 < dVar1) {
    *N = ellipsoid.a / dVar1;
  }
  return 1e-06 < dVar1;
}

Assistant:

bool GetN(const BLH blh, const ELLIPSOID ellipsoid, double &N)
{
    double sinB = sin(Deg2Rad(blh.B));
    double sub = sqrt(1 - ellipsoid.e2 * sinB * sinB);
    if(sub <= 1e-6)
        return false;
    N = ellipsoid.a / sub;

    return true;
}